

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<8,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  TriangleMesh *pTVar10;
  BuildPrim *pBVar11;
  long lVar12;
  char *pcVar13;
  MutexSys *pMVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar29;
  undefined1 in_ZMM0 [64];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  vuint4 vgeomID;
  Lock<embree::MutexSys> local_d8;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  Lock<embree::MutexSys> local_a8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  value_type local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  vuint4 vprimID;
  
  auVar28 = in_ZMM0._0_16_;
  uVar4 = current->_begin;
  uVar5 = current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  vgeomID.field_0.v[0] = 0xb0;
  this_01 = pTVar9->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8.locked = true;
    local_a8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_d8.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_d8.locked = true;
    auVar28 = (undefined1  [16])0x0;
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_78);
    Lock<embree::MutexSys>::~Lock(&local_d8);
    Lock<embree::MutexSys>::~Lock(&local_a8);
  }
  uVar21 = vgeomID.field_0.v[0];
  pTVar9->bytesUsed = pTVar9->bytesUsed + vgeomID.field_0.v[0];
  sVar24 = pTVar9->cur;
  uVar25 = (ulong)(-(int)sVar24 & 0xf);
  uVar22 = sVar24 + vgeomID.field_0.v[0] + uVar25;
  pTVar9->cur = uVar22;
  if (pTVar9->end < uVar22) {
    pTVar9->cur = sVar24;
    pMVar14 = (MutexSys *)pTVar9->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar14 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar14 == 0) {
      local_d8.mutex = pMVar14;
      pauVar23 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_d8);
      pTVar9->ptr = (char *)pauVar23;
      sVar24 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar24;
      pTVar9->end = (size_t)local_d8.mutex;
      pTVar9->cur = uVar21;
      if (local_d8.mutex < (ulong)uVar21) {
        pTVar9->cur = 0;
        local_d8.mutex = (MutexSys *)pTVar9->allocBlockSize;
        pauVar23 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_d8);
        pTVar9->ptr = (char *)pauVar23;
        sVar24 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar24;
        pTVar9->end = (size_t)local_d8.mutex;
        pTVar9->cur = uVar21;
        if (local_d8.mutex < (ulong)uVar21) {
          pTVar9->cur = 0;
          pauVar23 = (undefined1 (*) [16])0x0;
          goto LAB_00e05109;
        }
      }
      pTVar9->bytesWasted = sVar24;
    }
    else {
      pauVar23 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar25;
    pauVar23 = (undefined1 (*) [16])(pTVar9->ptr + (uVar22 - vgeomID.field_0._0_8_));
  }
LAB_00e05109:
  vgeomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar28,auVar28);
  uStack_b8 = 0;
  uStack_b0 = 0;
  local_d8.mutex = (MutexSys *)0x0;
  local_d8.locked = false;
  local_d8._9_7_ = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_a8.mutex = (MutexSys *)0x0;
  local_a8.locked = false;
  local_a8._9_7_ = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_78 = (value_type)0x0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  pTVar10 = this->mesh;
  pBVar11 = this->morton;
  uVar6 = this->geomID_;
  aVar30.m128[2] = INFINITY;
  aVar30._0_8_ = 0x7f8000007f800000;
  aVar30.m128[3] = INFINITY;
  aVar29.m128[2] = -INFINITY;
  aVar29._0_8_ = 0xff800000ff800000;
  aVar29.m128[3] = -INFINITY;
  vprimID.field_0 = vgeomID.field_0;
  for (lVar26 = 0; (ulong)(uVar5 - uVar4) << 2 != lVar26; lVar26 = lVar26 + 4) {
    uVar7 = *(uint *)((long)&pBVar11[uVar4].field_0 + lVar26 * 2 + 4);
    lVar27 = (ulong)uVar7 * *(long *)&pTVar10->field_0x68;
    lVar12 = *(long *)&(pTVar10->super_Geometry).field_0x58;
    pcVar13 = (pTVar10->vertices0).super_RawBufferView.ptr_ofs;
    sVar24 = (pTVar10->vertices0).super_RawBufferView.stride;
    auVar28 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + lVar27) * sVar24);
    auVar2 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + 4 + lVar27) * sVar24);
    auVar3 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + 8 + lVar27) * sVar24);
    auVar15 = vminps_avx((undefined1  [16])aVar30,auVar28);
    auVar16 = vminps_avx(auVar2,auVar3);
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx((undefined1  [16])aVar29,auVar28);
    auVar16 = vmaxps_avx(auVar2,auVar3);
    aVar29 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar15,auVar16);
    *(int *)((long)&local_d8.mutex + lVar26) = auVar28._0_4_;
    uVar8 = vextractps_avx(auVar28,1);
    *(undefined4 *)((long)&uStack_c8 + lVar26) = uVar8;
    *(uint *)((long)&vgeomID.field_0 + lVar26) = uVar6;
    uVar8 = vextractps_avx(auVar28,2);
    *(undefined4 *)((long)&uStack_b8 + lVar26) = uVar8;
    *(int *)((long)&local_a8.mutex + lVar26) = auVar2._0_4_;
    uVar8 = vextractps_avx(auVar2,1);
    *(undefined4 *)((long)&uStack_98 + lVar26) = uVar8;
    *(uint *)((long)&vprimID.field_0 + lVar26) = uVar7;
    uVar8 = vextractps_avx(auVar2,2);
    *(undefined4 *)((long)&uStack_88 + lVar26) = uVar8;
    *(int *)((long)&local_78 + lVar26) = auVar3._0_4_;
    uVar8 = vextractps_avx(auVar3,1);
    *(undefined4 *)((long)&uStack_68 + lVar26) = uVar8;
    uVar8 = vextractps_avx(auVar3,2);
    *(undefined4 *)((long)&uStack_58 + lVar26) = uVar8;
  }
  auVar28[8] = local_d8.locked;
  auVar28._0_8_ = local_d8.mutex;
  auVar28._9_7_ = local_d8._9_7_;
  auVar2._8_8_ = uStack_c0;
  auVar2._0_8_ = uStack_c8;
  auVar3._8_8_ = uStack_b0;
  auVar3._0_8_ = uStack_b8;
  auVar15[8] = local_a8.locked;
  auVar15._0_8_ = local_a8.mutex;
  auVar15._9_7_ = local_a8._9_7_;
  auVar16._8_8_ = uStack_90;
  auVar16._0_8_ = uStack_98;
  auVar17._8_8_ = uStack_80;
  auVar17._0_8_ = uStack_88;
  auVar18._8_8_ = uStack_70;
  auVar18._0_8_ = local_78;
  auVar19._8_8_ = uStack_60;
  auVar19._0_8_ = uStack_68;
  auVar20._8_8_ = uStack_50;
  auVar20._0_8_ = uStack_58;
  auVar28 = vmovntps_avx(auVar28);
  *pauVar23 = auVar28;
  auVar28 = vmovntps_avx(auVar2);
  pauVar23[1] = auVar28;
  auVar28 = vmovntps_avx(auVar3);
  pauVar23[2] = auVar28;
  auVar28 = vmovntps_avx(auVar15);
  pauVar23[3] = auVar28;
  auVar28 = vmovntps_avx(auVar16);
  pauVar23[4] = auVar28;
  auVar28 = vmovntps_avx(auVar17);
  pauVar23[5] = auVar28;
  auVar28 = vmovntps_avx(auVar18);
  pauVar23[6] = auVar28;
  auVar28 = vmovntps_avx(auVar19);
  pauVar23[7] = auVar28;
  auVar28 = vmovntps_avx(auVar20);
  pauVar23[8] = auVar28;
  auVar28 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
  pauVar23[9] = auVar28;
  auVar28 = vmovntps_avx((undefined1  [16])vprimID.field_0);
  pauVar23[10] = auVar28;
  (__return_storage_ptr__->ref).ptr = (ulong)pauVar23 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar30;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar29;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }